

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PassThrough.cpp
# Opt level: O2

Event * __thiscall PassThrough::update(PassThrough *this,double n_dt)

{
  SpikeEvent *this_00;
  
  if (this->eventType == Spike) {
    this_00 = (SpikeEvent *)operator_new(0x28);
    SpikeEvent::SpikeEvent(this_00,this->multiplicity,this->weight);
  }
  else {
    this_00 = (SpikeEvent *)operator_new(0x18);
    NoEvent::NoEvent((NoEvent *)this_00);
  }
  return &this_00->super_Event;
}

Assistant:

Event* PassThrough::update(double n_dt) {
    if(eventType == EventType::Spike) {
        return new SpikeEvent(multiplicity, weight);
    }
    else {
        return new NoEvent();
    }
}